

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O3

void pd_defaultlist(t_pd *x,t_symbol *s,int argc,t_atom *argv)

{
  t_atomtype tVar1;
  t_pointermethod UNRECOVERED_JUMPTABLE;
  int iVar2;
  code *pcVar3;
  word *pwVar4;
  t_pd p_Var5;
  bool bVar6;
  
  if (argc == 1) {
    tVar1 = argv->a_type;
    if (tVar1 == A_POINTER) {
      UNRECOVERED_JUMPTABLE = (*x)->c_pointermethod;
      pcVar3 = pd_defaultpointer;
    }
    else {
      if (tVar1 != A_SYMBOL) {
        if ((tVar1 == A_FLOAT) && ((*x)->c_floatmethod != pd_defaultfloat)) {
          (*(*x)->c_floatmethod)(x,(argv->a_w).w_float);
          return;
        }
        goto LAB_0016c5cf;
      }
      UNRECOVERED_JUMPTABLE = (t_pointermethod)(*x)->c_symbolmethod;
      pcVar3 = pd_defaultsymbol;
    }
    if (UNRECOVERED_JUMPTABLE != pcVar3) {
      (*UNRECOVERED_JUMPTABLE)(x,(argv->a_w).w_gpointer);
      return;
    }
  }
  else if ((argc == 0) && ((*x)->c_bangmethod != pd_defaultbang)) {
    (*(*x)->c_bangmethod)(x);
    return;
  }
LAB_0016c5cf:
  p_Var5 = *x;
  if (p_Var5->c_anymethod != pd_defaultanything) {
    (*p_Var5->c_anymethod)(x,&s_list,argc,argv);
    return;
  }
  if (p_Var5->c_patchable == '\0') {
    pd_error(x,"%s: no method for \'%s\'",p_Var5->c_name->s_name,s_list.s_name);
    return;
  }
  if (argc == 0) {
    pd_emptylist(x);
    return;
  }
  p_Var5 = x[4];
  if (argc != 1 && p_Var5 != (t_pd)0x0) {
    iVar2 = argc + -2;
    pwVar4 = &argv[1].a_w;
    do {
      if ((t_float)((t_atom *)(pwVar4 + -1))->a_type == 1.4013e-45) {
        pd_float((t_pd *)p_Var5,pwVar4->w_float);
      }
      else if ((t_float)((t_atom *)(pwVar4 + -1))->a_type == 4.2039e-45) {
        pd_pointer((t_pd *)p_Var5,pwVar4->w_gpointer);
      }
      else {
        pd_symbol((t_pd *)p_Var5,pwVar4->w_symbol);
      }
      p_Var5 = (t_pd)p_Var5->c_helpname;
      bVar6 = iVar2 != 0;
      iVar2 = iVar2 + -1;
    } while ((p_Var5 != (t_pd)0x0) && (pwVar4 = pwVar4 + 2, bVar6));
  }
  if (argv->a_type != A_FLOAT) {
    if (argv->a_type == A_POINTER) {
      pd_pointer(x,(argv->a_w).w_gpointer);
      return;
    }
    pd_symbol(x,(argv->a_w).w_symbol);
    return;
  }
  pd_float(x,(argv->a_w).w_float);
  return;
}

Assistant:

static void pd_defaultlist(t_pd *x, t_symbol *s, int argc, t_atom *argv)
{
            /* a list with no elements is handled by the 'bang' method if
            one exists. */
    if (argc == 0 && *(*x)->c_bangmethod != pd_defaultbang)
    {
        (*(*x)->c_bangmethod)(x);
        return;
    }
            /* a list with one element which is a number can be handled by a
            "float" method if any is defined; same for "symbol", "pointer". */
    if (argc == 1)
    {
        if (argv->a_type == A_FLOAT &&
        *(*x)->c_floatmethod != pd_defaultfloat)
        {
            (*(*x)->c_floatmethod)(x, argv->a_w.w_float);
            return;
        }
        else if (argv->a_type == A_SYMBOL &&
            *(*x)->c_symbolmethod != pd_defaultsymbol)
        {
            (*(*x)->c_symbolmethod)(x, argv->a_w.w_symbol);
            return;
        }
        else if (argv->a_type == A_POINTER &&
            *(*x)->c_pointermethod != pd_defaultpointer)
        {
            (*(*x)->c_pointermethod)(x, argv->a_w.w_gpointer);
            return;
        }
    }
        /* Next try for an "anything" method */
    if ((*x)->c_anymethod != pd_defaultanything)
        (*(*x)->c_anymethod)(x, &s_list, argc, argv);

        /* if the object is patchable (i.e., can have proper inlets)
            send it on to obj_list which will unpack the list into the inlets */
    else if ((*x)->c_patchable)
        obj_list((t_object *)x, s, argc, argv);
            /* otherwise gove up and complain. */
    else pd_defaultanything(x, &s_list, argc, argv);
}